

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_index.h
# Opt level: O0

void __thiscall S2CellIndex::RangeIterator::Next(RangeIterator *this)

{
  bool bVar1;
  ostream *poVar2;
  S2LogMessage local_28;
  S2LogMessageVoidify local_11;
  RangeIterator *local_10;
  RangeIterator *this_local;
  
  local_10 = this;
  bVar1 = done(this);
  if (!bVar1) {
    __gnu_cxx::
    __normal_iterator<const_S2CellIndex::RangeNode_*,_std::vector<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_>_>
    ::operator++(&this->it_);
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.h"
             ,0x1fa,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_28);
  poVar2 = std::operator<<(poVar2,"Check failed: !done() ");
  S2LogMessageVoidify::operator&(&local_11,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
}

Assistant:

inline void S2CellIndex::RangeIterator::Next() {
  S2_DCHECK(!done());
  ++it_;
}